

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXExportNode.cpp
# Opt level: O2

void __thiscall Assimp::FBX::Node::BeginBinary(Node *this,StreamWriterLE *s)

{
  size_t sVar1;
  
  sVar1 = StreamWriter<false,_false>::Tell(s);
  this->start_pos = sVar1;
  StreamWriter<false,_false>::Put<unsigned_int>(s,0);
  StreamWriter<false,_false>::Put<unsigned_int>(s,0);
  StreamWriter<false,_false>::Put<unsigned_int>(s,0);
  StreamWriter<false,_false>::Put<unsigned_char>(s,(uchar)(this->name)._M_string_length);
  StreamWriter<false,_false>::PutString(s,&this->name);
  sVar1 = StreamWriter<false,_false>::Tell(s);
  this->property_start = sVar1;
  return;
}

Assistant:

void FBX::Node::BeginBinary(Assimp::StreamWriterLE &s)
{
    // remember start pos so we can come back and write the end pos
    this->start_pos = s.Tell();

    // placeholders for end pos and property section info
    s.PutU4(0); // end pos
    s.PutU4(0); // number of properties
    s.PutU4(0); // total property section length

    // node name
    s.PutU1(uint8_t(name.size())); // length of node name
    s.PutString(name); // node name as raw bytes

    // property data comes after here
    this->property_start = s.Tell();
}